

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * getLinkedTargetsContent<cmLinkItem>
                   (string *__return_storage_ptr__,
                   vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libraries,cmTarget *target,
                   cmTarget *headTarget,cmGeneratorExpressionContext *context,
                   cmGeneratorExpressionDAGChecker *dagChecker,string *interfacePropertyName)

{
  string *input;
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string sep;
  string depString;
  string local_148;
  long *local_128 [2];
  long local_118 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  string *local_100;
  undefined1 *local_f8;
  char *local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string local_78;
  cmGeneratorExpressionDAGChecker *local_58;
  cmGeneratorExpressionContext *local_50;
  cmTarget *local_48;
  cmTarget *local_40;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_38;
  
  local_108 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_108;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_f8 = &local_e8;
  local_f0 = (char *)0x0;
  local_e8 = 0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  pcVar4 = (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_100 = __return_storage_ptr__;
  local_58 = dagChecker;
  local_50 = context;
  local_48 = headTarget;
  if (pcVar4 != (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    local_40 = target;
    local_38 = libraries;
    do {
      if (pcVar4->Target != target && pcVar4->Target != (cmTarget *)0x0) {
        local_128[0] = local_118;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_128,local_f8,local_f0 + (long)local_f8);
        std::__cxx11::string::append((char *)local_128);
        plVar1 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_128,(ulong)(pcVar4->Target->Name)._M_dataplus._M_p
                                   );
        plVar2 = plVar1 + 2;
        if ((long *)*plVar1 == plVar2) {
          local_c8 = *plVar2;
          lStack_c0 = plVar1[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar2;
          local_d8 = (long *)*plVar1;
        }
        local_d0 = plVar1[1];
        *plVar1 = (long)plVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_d8);
        plVar2 = plVar1 + 2;
        if ((long *)*plVar1 == plVar2) {
          local_a8 = *plVar2;
          lStack_a0 = plVar1[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar2;
          local_b8 = (long *)*plVar1;
        }
        local_b0 = plVar1[1];
        *plVar1 = (long)plVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_b8,
                                    (ulong)(interfacePropertyName->_M_dataplus)._M_p);
        plVar2 = plVar1 + 2;
        if ((long *)*plVar1 == plVar2) {
          local_88 = *plVar2;
          lStack_80 = plVar1[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar2;
          local_98 = (long *)*plVar1;
        }
        local_90 = plVar1[1];
        *plVar1 = (long)plVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
        psVar3 = (size_type *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar1 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar3) {
          local_148.field_2._M_allocated_capacity = *psVar3;
          local_148.field_2._8_8_ = plVar1[3];
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar3;
          local_148._M_dataplus._M_p = (pointer)*plVar1;
        }
        local_148._M_string_length = plVar1[1];
        *plVar1 = (long)psVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_128[0] != local_118) {
          operator_delete(local_128[0],local_118[0] + 1);
        }
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,local_f0,0x4f7d8b);
        libraries = local_38;
        target = local_40;
      }
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  input = local_100;
  if (local_78._M_string_length != 0) {
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (&local_148,&local_78,target->Makefile,local_50,local_48,target,local_58);
    std::__cxx11::string::operator=((string *)input,(string *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  cmGeneratorExpression::StripEmptyListElements(&local_148,input);
  std::__cxx11::string::operator=((string *)input,(string *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  return input;
}

Assistant:

std::string
getLinkedTargetsContent(
  std::vector<T> const &libraries,
  cmTarget const* target,
  cmTarget const* headTarget,
  cmGeneratorExpressionContext *context,
  cmGeneratorExpressionDAGChecker *dagChecker,
  const std::string &interfacePropertyName)
{
  std::string linkedTargetsContent;
  std::string sep;
  std::string depString;
  for (typename std::vector<T>::const_iterator it = libraries.begin();
       it != libraries.end(); ++it)
    {
    // Broken code can have a target in its own link interface.
    // Don't follow such link interface entries so as not to create a
    // self-referencing loop.
    if (it->Target && it->Target != target)
      {
      depString +=
        sep + "$<TARGET_PROPERTY:" +
        it->Target->GetName() + "," + interfacePropertyName + ">";
      sep = ";";
      }
    }
  if(!depString.empty())
    {
    linkedTargetsContent =
        cmGeneratorExpressionNode::EvaluateDependentExpression(depString,
                                        target->GetMakefile(), context,
                                        headTarget, target, dagChecker);
    }
  linkedTargetsContent =
    cmGeneratorExpression::StripEmptyListElements(linkedTargetsContent);
  return linkedTargetsContent;
}